

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainingLayers.cpp
# Opt level: O0

void CoreMLConverter::convertCaffeTrainingLayers(ConvertLayerParameters layerParameters)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  LayerParameter *this;
  ostream *poVar4;
  string *psVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  reference __k;
  mapped_type *this_01;
  NetParameter *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range3;
  string input;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mappingDataBlobNames;
  int numberOfLayers;
  LayerParameter *caffeLayer;
  int layerId;
  
  iVar3 = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  this = caffe::NetParameter::layer(in_stack_00000008,iVar3);
  iVar2 = caffe::NetParameter::layer_size(in_stack_00000008);
  input.field_2._8_1_ = layerParameters.isClassifier;
  input.field_2._9_7_ = layerParameters._25_7_;
  poVar4 = std::operator<<((ostream *)&std::cout,"WARNING: Skipping training related layer \'");
  psVar5 = caffe::LayerParameter::name_abi_cxx11_(this);
  poVar4 = std::operator<<(poVar4,(string *)psVar5);
  poVar4 = std::operator<<(poVar4,"\' of type \'");
  psVar5 = caffe::LayerParameter::type_abi_cxx11_(this);
  poVar4 = std::operator<<(poVar4,(string *)psVar5);
  poVar4 = std::operator<<(poVar4,"\'.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (((iVar3 != iVar2 + -1) && (iVar3 = caffe::LayerParameter::top_size(this), iVar3 != 0)) &&
     (iVar3 = caffe::LayerParameter::bottom_size(this), iVar3 != 0)) {
    psVar5 = caffe::LayerParameter::bottom_abi_cxx11_(this,0);
    std::__cxx11::string::string((string *)&__range3,(string *)psVar5);
    this_00 = caffe::LayerParameter::top_abi_cxx11_(this);
    __end3 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(this_00);
    output = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::end(this_00);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator!=(&__end3,(iterator *)&output), bVar1) {
      __k = google::protobuf::internal::
            RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&__end3);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)input.field_2._8_8_,__k);
      std::__cxx11::string::operator=((string *)this_01,(string *)&__range3);
      google::protobuf::internal::
      RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3);
    }
    std::__cxx11::string::~string((string *)&__range3);
  }
  return;
}

Assistant:

void CoreMLConverter::convertCaffeTrainingLayers(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int numberOfLayers = layerParameters.prototxt.layer_size();
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    
    std::cout<< "WARNING: Skipping training related layer '" << caffeLayer.name() << "' of type '"
    << caffeLayer.type() << "'." << std::endl;
    
    if (layerId != numberOfLayers-1){
        if (caffeLayer.top_size() != 0 && caffeLayer.bottom_size() != 0) {
            std::string input = caffeLayer.bottom(0);
            for (const auto& output: caffeLayer.top()){
                mappingDataBlobNames[output] = input;
            }
        }
    }
}